

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double __thiscall llvm::detail::DoubleAPFloat::remainder(DoubleAPFloat *this,double __x,double __y)

{
  double __x_00;
  double extraout_XMM0_Qa;
  undefined1 local_a0 [32];
  DoubleAPFloat local_80;
  APFloat local_70;
  undefined1 local_48 [4];
  opStatus Ret;
  undefined1 local_38 [8];
  APFloat Tmp;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1034,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::remainder(const DoubleAPFloat &)")
    ;
  }
  bitcastToAPInt((DoubleAPFloat *)local_48);
  APFloat::APFloat((APFloat *)local_38,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_48);
  APInt::~APInt((APInt *)local_48);
  bitcastToAPInt(&local_80);
  APFloat::APFloat(&local_70,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_80);
  APFloat::remainder((APFloat *)local_38,__x_00,__y);
  APFloat::~APFloat(&local_70);
  APInt::~APInt((APInt *)&local_80);
  APFloat::bitcastToAPInt((APFloat *)local_a0);
  DoubleAPFloat((DoubleAPFloat *)(local_a0 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_a0);
  operator=(this,(DoubleAPFloat *)(local_a0 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_a0 + 0x10));
  APInt::~APInt((APInt *)local_a0);
  APFloat::~APFloat((APFloat *)local_38);
  return extraout_XMM0_Qa;
}

Assistant:

APFloat::opStatus DoubleAPFloat::remainder(const DoubleAPFloat &RHS) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret =
      Tmp.remainder(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()));
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}